

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int checkroots_cerr(double *phi,int *p,double *theta,int *q,double *PHI,int *P,double *THETA,int *Q)

{
  int iVar1;
  int out;
  int ret;
  int *P_local;
  double *PHI_local;
  int *q_local;
  double *theta_local;
  int *p_local;
  double *phi_local;
  
  if ((*p < 1) || (iVar1 = archeck(*p,phi), iVar1 != 0)) {
    if (0 < *q) {
      invertroot(*q,theta);
    }
    if (((*P == *P) && (0 < *P)) && (iVar1 = archeck(*P,PHI), iVar1 == 0)) {
      printf("\nnon-stationary seasonal AR part\n");
      phi_local._4_4_ = 0xc;
    }
    else {
      if ((*Q == *Q) && (0 < *Q)) {
        invertroot(*Q,THETA);
      }
      phi_local._4_4_ = 1;
    }
  }
  else {
    printf("\nnon-stationary AR part\n");
    phi_local._4_4_ = 10;
  }
  return phi_local._4_4_;
}

Assistant:

static int checkroots_cerr(double *phi, int *p, double *theta, int *q, double *PHI, int *P, double *THETA, int *Q) {
	int ret,out;

	out = 1;

	if (*p > 0) {
		ret = archeck(*p,phi);
		if (!ret) {
			out = 10;
			printf("\nnon-stationary AR part\n");
			return out;
		}
	}

	if (*q > 0) {
		invertroot(*q,theta);
	}

	if (*P == *P) {
		if (*P > 0) {
			ret = archeck(*P,PHI);
			if (!ret) {
				out = 12;
				printf("\nnon-stationary seasonal AR part\n");
				return out;
			}
		}
	}

	if (*Q == *Q) {
		if (*Q > 0) {
			invertroot(*Q,THETA);
		}
	}

	return out;

}